

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightBounds * __thiscall
pbrt::PointLight::Bounds(LightBounds *__return_storage_ptr__,PointLight *this)

{
  float fVar1;
  Float FVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  Point3<float> PVar5;
  Tuple3<pbrt::Point3,_float> local_40;
  Tuple3<pbrt::Point3,_float> local_30;
  
  auVar4 = in_ZMM0._8_56_;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 0.0;
  PVar5 = Transform::operator()(&(this->super_LightBase).renderFromLight,(Point3<float> *)&local_40)
  ;
  local_30.z = PVar5.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar4;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 1.0;
  local_30._0_8_ = vmovlps_avx(auVar3._0_16_);
  fVar1 = this->scale;
  FVar2 = DenselySampledSpectrum::MaxValue(&this->I);
  LightBounds::LightBounds
            (__return_storage_ptr__,(Point3f *)&local_30,(Vector3f *)&local_40,
             FVar2 * fVar1 * 12.566371,3.1415927,1.5707964,false);
  return __return_storage_ptr__;
}

Assistant:

LightBounds PointLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    return LightBounds(p, Vector3f(0, 0, 1), 4 * Pi * scale * I.MaxValue(), Pi, Pi / 2,
                       false);
}